

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType,unsigned_long&,duckdb::optionally_owned_ptr<duckdb::ColumnDataCollection>>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,PhysicalOperatorType *args_1,
          unsigned_long *args_2,optionally_owned_ptr<duckdb::ColumnDataCollection> *args_3)

{
  PhysicalOperatorType op_type;
  idx_t estimated_cardinality;
  PhysicalColumnDataScan *this_00;
  optionally_owned_ptr<duckdb::ColumnDataCollection> local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  this_00 = (PhysicalColumnDataScan *)ArenaAllocator::AllocateAligned(&this->arena,0xa0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  op_type = *args_1;
  estimated_cardinality = *args_2;
  local_68.owned.
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       *(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
         *)&(args_3->owned).
            super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
            .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>;
  local_68.ptr.ptr = (args_3->ptr).ptr;
  (args_3->owned).
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> =
       (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)0x0;
  (args_3->ptr).ptr = (ColumnDataCollection *)0x0;
  PhysicalColumnDataScan::PhysicalColumnDataScan
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_50,op_type,estimated_cardinality,
             &local_68);
  ::std::
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)&local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  local_38._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_38);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}